

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

void unres_data_del(unres_data *unres,uint32_t i)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = i + 1;
  uVar2 = unres->count - uVar1;
  if (unres->count < uVar1 || uVar2 == 0) {
    if (i == 0) {
      free(unres->node);
      unres->node = (lyd_node **)0x0;
    }
  }
  else {
    memmove(unres->node + i,unres->node + uVar1,(ulong)uVar2 << 3);
  }
  unres->count = unres->count - 1;
  return;
}

Assistant:

void
unres_data_del(struct unres_data *unres, uint32_t i)
{
    /* there are items after the one deleted */
    if (i+1 < unres->count) {
        /* we only move the data, memory is left allocated, why bother */
        memmove(&unres->node[i], &unres->node[i+1], (unres->count-(i+1)) * sizeof *unres->node);

    /* deleting the last item */
    } else if (i == 0) {
        free(unres->node);
        unres->node = NULL;
    }

    /* if there are no items after and it is not the last one, just move the counter */
    --unres->count;
}